

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O3

trt_keyword_stmt * tro_read_module_name(trt_keyword_stmt *__return_storage_ptr__,trt_tree_ctx *tc)

{
  lysp_module *plVar1;
  long lVar2;
  char *pcVar3;
  bool bVar4;
  
  if (tc != (trt_tree_ctx *)0x0) {
    if (tc->lysc_tree == '\0') {
      plVar1 = tc->pmod;
      bVar4 = (plVar1->field_0x79 & 2) != 0;
      pcVar3 = "submodule";
      if (!bVar4) {
        pcVar3 = "module";
      }
      __return_storage_ptr__->section_name = pcVar3;
      if (bVar4) {
        plVar1 = plVar1 + 1;
      }
      else {
        plVar1 = (lysp_module *)&plVar1->mod->name;
      }
      lVar2 = 0x18;
    }
    else {
      __return_storage_ptr__->section_name = "module";
      plVar1 = (lysp_module *)&tc->cmod->mod->name;
      lVar2 = 0x28;
    }
    __return_storage_ptr__->argument = (char *)plVar1->mod;
    __return_storage_ptr__->has_node = *(long *)(&tc->lysc_tree + lVar2) != 0;
    return __return_storage_ptr__;
  }
  __assert_fail("tc",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_tree.c"
                ,0xa1f,"struct trt_keyword_stmt tro_read_module_name(const struct trt_tree_ctx *)");
}

Assistant:

static struct trt_keyword_stmt
tro_read_module_name(const struct trt_tree_ctx *tc)
{
    assert(tc);
    struct trt_keyword_stmt ret;

    ret.section_name = !tc->lysc_tree && tc->pmod->is_submod ?
            TRD_KEYWORD_SUBMODULE :
            TRD_KEYWORD_MODULE;

    ret.argument = !tc->lysc_tree ?
            LYSP_MODULE_NAME(tc->pmod) :
            tc->cmod->mod->name;

    ret.has_node = tro_tree_ctx_get_node(tc) ? 1 : 0;

    return ret;
}